

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTPNStm * __thiscall CTcParser::parse_foreach(CTcParser *this,int *err)

{
  byte *pbVar1;
  int iVar2;
  CTcTokFileDesc *pCVar3;
  long lVar4;
  CTcPrsSymtab *pCVar5;
  CTcPrsSymtab *pCVar6;
  size_t len;
  CTcPrsSymtab *pCVar7;
  CTPNStmEnclosing *pCVar8;
  CTcTokenizer *this_00;
  tc_toktyp_t tVar9;
  CTPNStm *pCVar10;
  ulong uVar11;
  CTcTokFileDesc *pCVar12;
  CTPNStmEnclosing *this_01;
  int *sym;
  
  this_00 = G_tok;
  pCVar3 = G_tok->last_desc_;
  lVar4 = G_tok->last_linenum_;
  pCVar5 = this->local_symtab_;
  pCVar6 = this->enclosing_local_symtab_;
  this->enclosing_local_symtab_ = pCVar5;
  sym = err;
  tVar9 = CTcTokenizer::next(this_00);
  if (tVar9 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    sym = (int *)0x2ba7;
    CTcTokenizer::log_error_curtok(G_tok,0x2ba7);
  }
  tVar9 = (G_tok->curtok_).typ_;
  if ((tVar9 != TOKT_SYM) && (tVar9 != TOKT_LPAR)) {
    if (tVar9 != TOKT_LOCAL) {
      CTcTokenizer::log_error_curtok(G_tok,0x2ba8);
      return (CTPNStm *)0x0;
    }
    create_scope_local_symtab(this);
    tVar9 = CTcTokenizer::next(G_tok);
    if (tVar9 == TOKT_SYM) {
      sym = (int *)(G_tok->curtok_).text_;
      len = (G_tok->curtok_).text_len_;
      iVar2 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar2) {
        this->max_local_cnt_ = iVar2 + 1;
      }
      this->local_cnt_ = iVar2 + 1;
      CTcPrsSymtab::add_local(this->local_symtab_,(textchar_t *)sym,len,iVar2,0,0,0);
    }
    else {
      sym = (int *)0x2b29;
      CTcTokenizer::log_error_curtok(G_tok,0x2b29);
    }
  }
  pCVar10 = (CTPNStm *)parse_expr(this);
  if (pCVar10 == (CTPNStm *)0x0) goto LAB_0020282a;
  if ((((G_tok->curtok_).typ_ == TOKT_SYM) && ((G_tok->curtok_).text_len_ == 2)) &&
     (*(short *)(G_tok->curtok_).text_ == 0x6e69)) {
LAB_002027f7:
    CTcTokenizer::next(G_tok);
  }
  else {
    sym = (int *)0x2ba9;
    CTcTokenizer::log_error_curtok(G_tok,0x2ba9);
    uVar11 = (ulong)(G_tok->curtok_).typ_;
    if (uVar11 < 0x2b) {
      if ((0x40001800004U >> (uVar11 & 0x3f) & 1) != 0) {
        return (CTPNStm *)0x0;
      }
      if (uVar11 == 0x14) goto LAB_002027f7;
    }
  }
  pCVar12 = (CTcTokFileDesc *)parse_expr(this);
  if (pCVar12 != (CTcTokFileDesc *)0x0) {
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      sym = (int *)0x2baa;
      CTcTokenizer::log_error_curtok(G_tok,0x2baa);
    }
    this_01 = (CTPNStmEnclosing *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x60,(size_t)sym);
    iVar2 = this->local_cnt_;
    if (this->max_local_cnt_ <= iVar2) {
      this->max_local_cnt_ = iVar2 + 1;
    }
    pCVar7 = this->local_symtab_;
    pCVar8 = this->enclosing_stm_;
    this->local_cnt_ = iVar2 + 1;
    CTPNStmBase::CTPNStmBase((CTPNStmBase *)this_01);
    this_01->enclosing_ = pCVar8;
    this_01[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase = (_func_int **)pCVar10;
    this_01[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)pCVar12;
    this_01[1].super_CTPNStm.super_CTPNStmBase.linenum_ = (long)pCVar7;
    this_01[1].super_CTPNStm.super_CTPNStmBase.file_ = (CTcTokFileDesc *)0x0;
    *(int *)&this_01[1].enclosing_ = iVar2;
    pbVar1 = (byte *)((long)&this_01[1].enclosing_ + 4);
    *pbVar1 = *pbVar1 & 0xfe;
    (this_01->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031a970;
    pCVar8 = this->enclosing_stm_;
    this->enclosing_stm_ = this_01;
    pCVar12 = (CTcTokFileDesc *)parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
    this->enclosing_stm_ = pCVar8;
    if (*err == 0) {
      this_01[1].super_CTPNStm.super_CTPNStmBase.file_ = pCVar12;
      (this_01->super_CTPNStm).super_CTPNStmBase.file_ = pCVar3;
      (this_01->super_CTPNStm).super_CTPNStmBase.linenum_ = lVar4;
      *(byte *)((long)&this_01[1].enclosing_ + 4) =
           *(byte *)((long)&this_01[1].enclosing_ + 4) & 0xfe | this->local_symtab_ != pCVar5;
      this->local_symtab_ = pCVar5;
      this->enclosing_local_symtab_ = pCVar6;
      return &this_01->super_CTPNStm;
    }
    return (CTPNStm *)0x0;
  }
LAB_0020282a:
  *err = 1;
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_foreach(int *err)
{
    tcprs_scope_t scope_data;
    CTcPrsNode *iter_expr;
    CTcPrsNode *coll_expr;
    CTPNStm *body_stm;
    CTPNStmForeach *foreach_stm;
    CTcTokFileDesc *file;
    long linenum;
    CTPNStmEnclosing *old_enclosing;

    /* save the current line information for later */
    G_tok->get_last_pos(&file, &linenum);

    /* 
     *   enter a scope, in case we create a local symbol table for local
     *   variables defined within the 'for' statement 
     */
    enter_scope(&scope_data);

    /* parse the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and proceed, assuming it was simply left out */
        G_tok->log_error_curtok(TCERR_REQ_FOREACH_LPAR);
    }

    /* we don't have the iterator lvalue or collection expression yet */
    iter_expr = 0;
    coll_expr = 0;

    /* check for 'local' before the iteration variable */
    switch (G_tok->cur())
    {
    case TOKT_LOCAL:
        /* 
         *   if we haven't created our own symbol table local to the 'for'
         *   loop, do so now 
         */
        create_scope_local_symtab();

        /* skip the 'local' keyword and get the local name */
        if (G_tok->next() == TOKT_SYM)
        {
            /* add the local symbol */
            local_symtab_->add_local(G_tok->getcur()->get_text(),
                                     G_tok->getcur()->get_text_len(),
                                     alloc_local(), FALSE, FALSE, FALSE);
        }
        else
        {
            /* log the error */
            G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
        }

        /* go handle the local as the iteration expression */
        goto do_expr;

    case TOKT_LPAR:
    case TOKT_SYM:
    do_expr:
        /* parse the iterator lvalue expression */
        iter_expr = parse_expr();
        if (iter_expr == 0)
        {
            *err = TRUE;
            return 0;
        }
        break;
        
    default:
        /* premature end of the list - log an error and stop */
        G_tok->log_error_curtok(TCERR_MISSING_FOREACH_EXPR);
        return 0;
    }

    /* require the 'in' keyword */
    if (G_tok->cur() != TOKT_SYM || !G_tok->getcur()->text_matches("in", 2))
    {
        /* log an error */
        G_tok->log_error_curtok(TCERR_FOREACH_REQ_IN);

        /* see what we have */
        switch(G_tok->cur())
        {
        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_EOF:
            /* probably end of statement */
            return 0;
            
        case TOKT_RPAR:
            /* 
             *   probably an extra paren in the variable expression - skip
             *   the paren and continue 
             */
            G_tok->next();
            break;

        default:
            /* probably just left out 'in' - continue from here */
            break;
        }
    }
    else
    {
        /* skip the 'in' */
        G_tok->next();
    }

    /* parse the collection expression */
    coll_expr = parse_expr();
    if (coll_expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* make sure we have the close paren */
    if (G_tok->cur() != TOKT_RPAR)
    {
        /* 
         *   log the error, but continue from here on the assumption that
         *   they simply left out the paren 
         */
        G_tok->log_error_curtok(TCERR_REQ_FOREACH_RPAR);
    }
    else
    {
        /* skip the paren */
        G_tok->next();
    }

    /* 
     *   create the "foreach" node, allocating a private local variable
     *   for holding the iterator object 
     */
    foreach_stm = new CTPNStmForeach(iter_expr, coll_expr, 
                                     local_symtab_, enclosing_stm_,
                                     alloc_local());

    /* set the "foreach" node to enclose its body */
    old_enclosing = set_enclosing_stm(foreach_stm);

    /* parse the body of the loop */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if that failed, return failure */
    if (*err)
        return 0;

    /* set the body of the 'for' */
    foreach_stm->set_body(body_stm);

    /* set the original statement position in the node */
    foreach_stm->set_source_pos(file, linenum);

    /* set the own-scope flag */
    foreach_stm->set_has_own_scope(local_symtab_ != scope_data.local_symtab);

    /* exit any local scope we created */
    leave_scope(&scope_data);

    /* return the new statement node */
    return foreach_stm;
}